

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_int_array(jsmntok_t *tokens,int i,uint8_t *json_chunk,int *out_array,int size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = -1;
  if (((tokens[i].type == JSMN_ARRAY) && (tokens[i].size == size)) && (iVar4 = i + 1, 0 < size)) {
    uVar3 = 0;
    do {
      uVar1 = (int)uVar3 + iVar4;
      if (tokens[uVar1].type != JSMN_PRIMITIVE) {
        return -1;
      }
      iVar2 = cgltf_json_to_int(tokens + uVar1,json_chunk);
      out_array[uVar3] = iVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)size != uVar3);
    iVar4 = iVar4 + (int)uVar3;
  }
  return iVar4;
}

Assistant:

static int cgltf_parse_json_int_array(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, int* out_array, int size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	if (tokens[i].size != size)
	{
		return CGLTF_ERROR_JSON;
	}
	++i;
	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_PRIMITIVE);
		out_array[j] = cgltf_json_to_int(tokens + i, json_chunk);
		++i;
	}
	return i;
}